

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrGetCurrentInteractionProfile
                   (XrSession session,XrPath topLevelUserPath,
                   XrInteractionProfileState *interactionProfile)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_34;
  LoaderInstance *pLStack_30;
  XrResult result;
  LoaderInstance *loader_instance;
  XrInteractionProfileState *interactionProfile_local;
  XrPath topLevelUserPath_local;
  XrSession session_local;
  
  loader_instance = (LoaderInstance *)interactionProfile;
  interactionProfile_local = (XrInteractionProfileState *)topLevelUserPath;
  topLevelUserPath_local = (XrPath)session;
  local_34 = ActiveLoaderInstance::Get(&stack0xffffffffffffffd0,"xrGetCurrentInteractionProfile");
  if (XR_ERROR_VALIDATION_FAILURE < local_34) {
    this = LoaderInstance::DispatchTable(pLStack_30);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_34 = (*pXVar1->GetCurrentInteractionProfile)
                         ((XrSession)topLevelUserPath_local,(XrPath)interactionProfile_local,
                          (XrInteractionProfileState *)loader_instance);
  }
  return local_34;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrGetCurrentInteractionProfile(
    XrSession                                   session,
    XrPath                                      topLevelUserPath,
    XrInteractionProfileState*                  interactionProfile) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrGetCurrentInteractionProfile");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->GetCurrentInteractionProfile(session, topLevelUserPath, interactionProfile);
    }
    return result;
}